

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

void __thiscall Board::Board(Board *this,BoardSize size,BoardMode mode)

{
  mapped_type mVar1;
  pointer puVar2;
  mapped_type *pmVar3;
  pointer puVar4;
  unsigned_long uVar5;
  key_type local_24;
  
  this->size = size;
  pmVar3 = std::
           map<BoardSize,_unsigned_long,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_unsigned_long>_>_>
           ::at(&Maps::boardSizeInt,&local_24);
  mVar1 = *pmVar3;
  this->sizeInt = mVar1;
  this->mode = mode;
  this->nullValue = mVar1 * mVar1 - 1;
  (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->values,mVar1 * mVar1);
  puVar4 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar4 != puVar2) {
    uVar5 = 0;
    do {
      *puVar4 = uVar5;
      uVar5 = uVar5 + 1;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar2);
  }
  return;
}

Assistant:

Board::Board( BoardSize size, BoardMode mode ) : size( size ),
                                                 mode( mode ),
                                                 sizeInt( Maps::boardSizeInt.at( size )),
                                                 nullValue( sizeInt * sizeInt - 1 )
{
    values.resize( sizeInt * sizeInt );
    std::iota( values.begin(), values.end(), 0 );
}